

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>
         *this)

{
  FloatFormat *pFVar1;
  double *pdVar2;
  _Base_ptr p_Var3;
  _Rb_tree_node_base *p_Var4;
  ostringstream *poVar5;
  Precision PVar6;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar7;
  Statement *pSVar8;
  ShaderExecutor *pSVar9;
  Variable<tcu::Vector<float,_4>_> *pVVar10;
  pointer pcVar11;
  TestStatus *pTVar12;
  pointer pVVar13;
  bool bVar14;
  int iVar15;
  undefined8 uVar16;
  long lVar17;
  long lVar18;
  IVal *pIVar19;
  undefined8 *puVar20;
  uint uVar21;
  string *psVar22;
  char *pcVar23;
  _Base_ptr p_Var24;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar25;
  byte bVar26;
  IVal reference1;
  IVal in2;
  FuncSet funcs;
  IVal in3;
  Environment env;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_> outputs;
  IVal in0;
  void *outputArr [2];
  FloatFormat highpFmt;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  void *inputArr [4];
  ostringstream oss;
  ResultCollector status;
  deUint32 in_stack_fffffffffffffa78;
  IVal local_579;
  string local_578;
  TestLog *local_550;
  size_t local_548;
  IVal *local_540;
  undefined1 local_538 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_528;
  _Rb_tree_node_base *local_518;
  double local_510;
  string local_4d8;
  TestStatus *local_4b8;
  long local_4b0;
  FloatFormat *local_4a8;
  long local_4a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_498;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>
  local_468;
  undefined1 local_438 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  double local_418;
  Precision local_410;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_408;
  undefined4 local_400;
  ios_base local_3c8 [8];
  ios_base local_3c0 [264];
  pointer local_2b8;
  pointer local_2b0;
  FloatFormat local_2a8;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_278;
  pointer local_218;
  pointer local_210;
  pointer local_208;
  pointer local_200;
  IVal local_1f8;
  ios_base local_188 [264];
  ResultCollector local_80;
  
  bVar26 = 0;
  this_00 = this->m_samplings;
  pFVar1 = &(this->m_caseCtx).floatFormat;
  PVar6 = (this->m_caseCtx).precision;
  sVar7 = (this->m_caseCtx).numRandoms;
  local_4b8 = __return_storage_ptr__;
  iVar15 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_4a8 = pFVar1;
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_278,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)pFVar1,(FloatFormat *)(ulong)PVar6,(Precision)sVar7,(ulong)(iVar15 + 0xdeadbeef),
             in_stack_fffffffffffffa78);
  pVVar13 = local_278.in0.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_548 = (long)local_278.in0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_278.in0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>::Outputs
            (&local_468,local_548);
  local_2a8.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_2a8.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_2a8.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_2a8.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_2a8.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_2a8.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_2a8.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_2a8.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_2a8._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_498._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_498._M_impl.super__Rb_tree_header._M_header;
  local_498._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_498._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_498._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_498._M_impl.super__Rb_tree_header._M_header._M_right =
       local_498._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_80);
  local_550 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_218 = local_278.in0.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_210 = local_278.in1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_208 = local_278.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_200 = local_278.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_2b8 = local_468.out0.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_2b0 = local_468.out1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  poVar5 = (ostringstream *)(local_438 + 8);
  local_438._0_8_ = local_550;
  std::__cxx11::ostringstream::ostringstream(poVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(SUB81(poVar5,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar5);
  std::ios_base::~ios_base(local_3c0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
  p_Var4 = (_Rb_tree_node_base *)(local_538 + 8);
  local_538._8_4_ = _S_red;
  local_528._M_allocated_capacity = 0;
  local_510 = 0.0;
  pSVar8 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  local_528._8_8_ = p_Var4;
  local_518 = p_Var4;
  (*pSVar8->_vptr_Statement[4])(pSVar8,local_538);
  if ((_Rb_tree_node_base *)local_528._8_8_ != p_Var4) {
    uVar16 = local_528._8_8_;
    do {
      (**(code **)(**(long **)(uVar16 + 0x20) + 0x30))(*(long **)(uVar16 + 0x20),&local_1f8);
      uVar16 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar16);
    } while ((_Rb_tree_node_base *)uVar16 != p_Var4);
  }
  if (local_510 != 0.0) {
    poVar5 = (ostringstream *)(local_438 + 8);
    local_438._0_8_ = local_550;
    std::__cxx11::ostringstream::ostringstream(poVar5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar5,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar5,local_578._M_dataplus._M_p,local_578._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_578._M_dataplus._M_p != &local_578.field_2) {
      operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar5);
    std::ios_base::~ios_base(local_3c0);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_538);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
  std::ios_base::~ios_base(local_188);
  pSVar9 = (this->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  (*pSVar9->_vptr_ShaderExecutor[2])(pSVar9,local_548,&local_218,&local_2b8,0);
  lVar17 = 0x10;
  do {
    local_438[lVar17 + -0x10] = 0;
    *(undefined8 *)(local_438 + lVar17 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(local_438 + lVar17) = 0xfff0000000000000;
    lVar17 = lVar17 + 0x18;
  } while (lVar17 != 0x70);
  lVar17 = 0x10;
  do {
    local_438[lVar17 + -0x10] = 0;
    *(undefined8 *)(local_438 + lVar17 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(local_438 + lVar17) = 0xfff0000000000000;
    lVar17 = lVar17 + 0x18;
  } while (lVar17 != 0x70);
  lVar17 = 0x10;
  do {
    *(undefined1 *)((long)&local_208 + lVar17) = 0;
    *(undefined8 *)((long)&local_200 + lVar17) = 0x7ff0000000000000;
    *(undefined8 *)(&local_1f8.m_data[0].m_hasNaN + lVar17) = 0xfff0000000000000;
    lVar17 = lVar17 + 0x18;
  } while (lVar17 != 0x70);
  lVar17 = 0x10;
  do {
    *(undefined1 *)((long)&local_208 + lVar17) = 0;
    *(undefined8 *)((long)&local_200 + lVar17) = 0x7ff0000000000000;
    *(undefined8 *)(&local_1f8.m_data[0].m_hasNaN + lVar17) = 0xfff0000000000000;
    lVar17 = lVar17 + 0x18;
  } while (lVar17 != 0x70);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_498,
             (this->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr,
             (IVal *)local_438);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (this->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)local_538);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (this->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_578);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_4d8);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_498,
             (this->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr,
             &local_1f8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (this->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             &local_579);
  if (local_278.in0.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_finish == pVVar13) {
    local_540 = (IVal *)0x0;
  }
  else {
    local_4b0 = local_548 + (local_548 == 0);
    lVar17 = 0;
    local_540 = (IVal *)0x0;
    do {
      pFVar1 = local_4a8;
      lVar18 = 0x10;
      do {
        *(undefined1 *)((long)&local_208 + lVar18) = 0;
        *(undefined8 *)((long)&local_200 + lVar18) = 0x7ff0000000000000;
        *(undefined8 *)(&local_1f8.m_data[0].m_hasNaN + lVar18) = 0xfff0000000000000;
        lVar18 = lVar18 + 0x18;
      } while (lVar18 != 0x70);
      lVar18 = 0x10;
      do {
        *(undefined1 *)((long)&local_208 + lVar18) = 0;
        *(undefined8 *)((long)&local_200 + lVar18) = 0x7ff0000000000000;
        *(undefined8 *)(&local_1f8.m_data[0].m_hasNaN + lVar18) = 0xfff0000000000000;
        lVar18 = lVar18 + 0x18;
      } while (lVar18 != 0x70);
      local_578._M_dataplus._M_p =
           *(pointer *)
            local_278.in0.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar17].m_data;
      local_578._M_string_length =
           *(size_type *)
            (local_278.in0.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar17].m_data + 2);
      local_4a0 = lVar17;
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doRound
                ((IVal *)local_538,local_4a8,(Vector<float,_4> *)&local_578);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_438,pFVar1,(IVal *)local_538);
      pIVar19 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_498,
                           (this->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      puVar20 = (undefined8 *)local_438;
      for (lVar18 = 0xc; lVar18 != 0; lVar18 = lVar18 + -1) {
        *(undefined8 *)pIVar19->m_data = *puVar20;
        puVar20 = puVar20 + (ulong)bVar26 * -2 + 1;
        pIVar19 = (IVal *)((long)pIVar19 + ((ulong)bVar26 * -2 + 1) * 8);
      }
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_498,
                 (this->m_variables).in1.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_498,
                 (this->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_498,
                 (this->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      local_410 = (this->m_caseCtx).precision;
      local_418 = pFVar1->m_maxValue;
      local_438._0_8_ = *(undefined8 *)pFVar1;
      local_438._8_4_ = pFVar1->m_fractionBits;
      local_438._12_4_ = pFVar1->m_hasSubnormal;
      local_428._M_allocated_capacity._0_4_ = pFVar1->m_hasInf;
      local_428._M_allocated_capacity._4_4_ = pFVar1->m_hasNaN;
      local_428._8_1_ = pFVar1->m_exactPrecision;
      local_428._9_3_ = *(undefined3 *)&pFVar1->field_0x19;
      local_428._12_4_ = *(undefined4 *)&pFVar1->field_0x1c;
      local_400 = 0;
      pSVar8 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      local_408 = &local_498;
      (*pSVar8->_vptr_Statement[3])(pSVar8,(string *)local_438);
      pIVar19 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_498,
                           (this->m_variables).out0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_438,&local_2a8,pIVar19);
      psVar22 = (string *)local_438;
      pIVar19 = &local_1f8;
      for (lVar18 = 0xc; lVar18 != 0; lVar18 = lVar18 + -1) {
        *(pointer *)pIVar19->m_data = (psVar22->_M_dataplus)._M_p;
        psVar22 = (string *)((long)psVar22 + (ulong)bVar26 * -0x10 + 8);
        pIVar19 = (IVal *)((long)pIVar19 + ((ulong)bVar26 * -2 + 1) * 8);
      }
      bVar14 = ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doContains
                         (&local_1f8,
                          local_468.out0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar17);
      local_438._0_8_ = local_438 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_438,"Shader output 0 is outside acceptable range","");
      bVar14 = tcu::ResultCollector::check(&local_80,bVar14,(string *)local_438);
      if ((TestLog *)local_438._0_8_ != (TestLog *)(local_438 + 0x10)) {
        operator_delete((void *)local_438._0_8_,
                        CONCAT44(local_428._M_allocated_capacity._4_4_,
                                 local_428._M_allocated_capacity._0_4_) + 1);
      }
      uVar21 = (int)local_540 + ((byte)~bVar14 & 1);
      pIVar19 = (IVal *)(ulong)uVar21;
      local_540 = pIVar19;
      if ((int)uVar21 < 0x65 && !bVar14) {
        local_438._0_8_ = local_550;
        poVar5 = (ostringstream *)(local_438 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar5);
        pcVar23 = "Failed";
        if (bVar14) {
          pcVar23 = "Passed";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,pcVar23,6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\t",1);
        pVVar10 = (this->m_variables).in0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.
                  m_ptr;
        pcVar11 = (pVVar10->m_name)._M_dataplus._M_p;
        local_538._0_8_ = &local_528;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_538,pcVar11,pcVar11 + (pVVar10->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,(char *)local_538._0_8_,
                   CONCAT44(local_538._12_4_,local_538._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," = ",3);
        valueToString<tcu::Vector<float,4>>
                  (&local_578,(shaderexecutor *)&local_2a8,
                   (FloatFormat *)
                   (local_278.in0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar17),(Vector<float,_4> *)pIVar19)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,local_578._M_dataplus._M_p,local_578._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_578._M_dataplus._M_p != &local_578.field_2) {
          operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_538._0_8_ != &local_528) {
          operator_delete((void *)local_538._0_8_,(ulong)(local_528._M_allocated_capacity + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\t",1);
        pVVar10 = (this->m_variables).out0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.
                  m_ptr;
        pcVar11 = (pVVar10->m_name)._M_dataplus._M_p;
        local_538._0_8_ = &local_528;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_538,pcVar11,pcVar11 + (pVVar10->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,(char *)local_538._0_8_,
                   CONCAT44(local_538._12_4_,local_538._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," = ",3);
        valueToString<tcu::Vector<float,4>>
                  (&local_578,(shaderexecutor *)&local_2a8,
                   (FloatFormat *)
                   (local_468.out0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar17),(Vector<float,_4> *)pIVar19)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,local_578._M_dataplus._M_p,local_578._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,"\tExpected range: ",0x11);
        intervalToString<tcu::Vector<float,4>>
                  (&local_4d8,(shaderexecutor *)&local_2a8,(FloatFormat *)&local_1f8,pIVar19);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,local_4d8._M_dataplus._M_p,local_4d8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
          operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_578._M_dataplus._M_p != &local_578.field_2) {
          operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_538._0_8_ != &local_528) {
          operator_delete((void *)local_538._0_8_,(ulong)(local_528._M_allocated_capacity + 1));
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar5);
        std::ios_base::~ios_base(local_3c0);
      }
      lVar17 = local_4a0 + 1;
    } while (lVar17 != local_4b0);
  }
  pTVar12 = local_4b8;
  iVar15 = (int)local_540;
  if (100 < iVar15) {
    poVar5 = (ostringstream *)(local_438 + 8);
    local_438._0_8_ = local_550;
    std::__cxx11::ostringstream::ostringstream(poVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"(Skipped ",9);
    std::ostream::operator<<(poVar5,iVar15 + -100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," messages.)",0xb);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar5);
    std::ios_base::~ios_base(local_3c0);
  }
  poVar5 = (ostringstream *)(local_438 + 8);
  if (iVar15 == 0) {
    local_438._0_8_ = local_550;
    std::__cxx11::ostringstream::ostringstream(poVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_438._0_8_ = local_550;
    std::__cxx11::ostringstream::ostringstream(poVar5);
    std::ostream::operator<<(poVar5,iVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream(poVar5);
  std::ios_base::~ios_base(local_3c0);
  if (iVar15 == 0) {
    local_438._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_438 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"Pass","");
    pTVar12->m_code = QP_TEST_RESULT_PASS;
    (pTVar12->m_description)._M_dataplus._M_p = (pointer)&(pTVar12->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar12->m_description,local_438._0_8_,
               (char *)(local_438._0_8_ + CONCAT44(local_438._12_4_,local_438._8_4_)));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_438 + 0x10)) goto LAB_0089e001;
    uVar16 = (_Base_ptr)
             CONCAT44(local_428._M_allocated_capacity._4_4_,local_428._M_allocated_capacity._0_4_);
    paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438._0_8_;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
    std::ostream::operator<<(local_438,iVar15);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
    std::ios_base::~ios_base(local_3c8);
    paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_438 + 0x10);
    local_438._0_8_ = paVar25;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_438," test failed. Check log for the details","");
    p_Var3 = (_Base_ptr)
             (CONCAT44(local_438._12_4_,local_438._8_4_) +
             CONCAT44(local_538._12_4_,local_538._8_4_));
    uVar16 = (_Base_ptr)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_538._0_8_ != &local_528) {
      uVar16 = local_528._M_allocated_capacity;
    }
    if ((ulong)uVar16 < p_Var3) {
      p_Var24 = (_Base_ptr)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._0_8_ != paVar25) {
        p_Var24 = (_Base_ptr)
                  CONCAT44(local_428._M_allocated_capacity._4_4_,
                           local_428._M_allocated_capacity._0_4_);
      }
      if (p_Var24 < p_Var3) goto LAB_0089de96;
      puVar20 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_438,0,(char *)0x0,local_538._0_8_);
    }
    else {
LAB_0089de96:
      puVar20 = (undefined8 *)std::__cxx11::string::_M_append(local_538,local_438._0_8_);
    }
    local_1f8.m_data[0]._0_8_ = &local_1f8.m_data[0].m_hi;
    pdVar2 = (double *)(puVar20 + 2);
    if ((double *)*puVar20 == pdVar2) {
      local_1f8.m_data[0].m_hi = *pdVar2;
      local_1f8.m_data[1]._0_4_ = *(undefined4 *)(puVar20 + 3);
      local_1f8.m_data[1]._4_4_ = *(undefined4 *)((long)puVar20 + 0x1c);
    }
    else {
      local_1f8.m_data[0].m_hi = *pdVar2;
      local_1f8.m_data[0]._0_8_ = (double *)*puVar20;
    }
    local_1f8.m_data[0].m_lo = (double)puVar20[1];
    *puVar20 = pdVar2;
    puVar20[1] = 0;
    *(undefined1 *)pdVar2 = 0;
    pTVar12->m_code = QP_TEST_RESULT_FAIL;
    (pTVar12->m_description)._M_dataplus._M_p = (pointer)&(pTVar12->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar12->m_description,local_1f8.m_data[0]._0_8_,
               (undefined1 *)((long)local_1f8.m_data[0].m_lo + local_1f8.m_data[0]._0_8_));
    if ((double *)local_1f8.m_data[0]._0_8_ != &local_1f8.m_data[0].m_hi) {
      operator_delete((void *)local_1f8.m_data[0]._0_8_,(long)local_1f8.m_data[0].m_hi + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._0_8_ != paVar25) {
      operator_delete((void *)local_438._0_8_,
                      CONCAT44(local_428._M_allocated_capacity._4_4_,
                               local_428._M_allocated_capacity._0_4_) + 1);
    }
    uVar16 = local_528._M_allocated_capacity;
    paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_538._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_538._0_8_ == &local_528) goto LAB_0089e001;
  }
  operator_delete(paVar25,(ulong)((long)&((_Base_ptr)uVar16)->_M_color + 1));
LAB_0089e001:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_message._M_dataplus._M_p != &local_80.m_message.field_2) {
    operator_delete(local_80.m_message._M_dataplus._M_p,
                    local_80.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_prefix._M_dataplus._M_p != &local_80.m_prefix.field_2) {
    operator_delete(local_80.m_prefix._M_dataplus._M_p,
                    local_80.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_498);
  if (local_468.out1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_468.out1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_468.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_468.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_468.out0.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_468.out0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_468.out0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_468.out0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in0.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar12;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}